

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<unsigned_long> __thiscall
kj::
Table<kj::StringPtr,_kj::TreeIndex<kj::_::(anonymous_namespace)::StringCompare>,_kj::TreeIndex<kj::_::(anonymous_namespace)::StringLengthCompare>_>
::Impl<1UL,_false>::insert
          (Impl<1UL,_false> *this,
          Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *table,
          size_t pos,StringPtr *row,uint skip)

{
  uint uVar1;
  ulong uVar2;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar3;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  Maybe<unsigned_long> MVar4;
  undefined1 local_98 [8];
  size_t pos_local;
  Iterator iter;
  StringPtr *local_70;
  long local_68;
  undefined **local_60;
  anon_union_40_1_a8c68091_for_NullableValue<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_table_h:450:5)>_2
  local_58;
  
  local_58.value.table =
       (Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *)local_98;
  if (skip == 1) {
    *this = (Impl<1UL,_false>)0x0;
    aVar3 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)pos;
  }
  else {
    local_70 = (table->rows).builder.ptr;
    local_68 = (long)(table->rows).builder.pos - (long)local_70 >> 4;
    local_98 = (undefined1  [8])((row->content).size_ - 1);
    local_58.value.indexObj = (HashIndex<kj::_::(anonymous_namespace)::StringHasher> *)&local_70;
    local_60 = &PTR_search_0021c0d0;
    pos_local = pos;
    local_58.value.success = (bool *)(table + 1);
    _::BTreeImpl::insert(&iter,(BTreeImpl *)&table[1].rows.builder.pos,(SearchKey *)&local_60);
    uVar2 = (ulong)iter.row;
    if (uVar2 == 0xe) {
      uVar2 = 0xe;
    }
    else {
      uVar1 = (iter.leaf)->rows[uVar2].i;
      if ((uVar1 != 0) &&
         (aVar3._0_4_ = uVar1 - 1, aVar3.value._4_4_ = 0,
         (undefined1  [8])(local_70[aVar3.value].content.size_ - 1) == local_98)) {
        *this = (Impl<1UL,_false>)0x1;
        ((anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)(this + 8))->value =
             (unsigned_long)aVar3;
        goto LAB_00162995;
      }
    }
    memmove((iter.leaf)->rows + uVar2 + 1,(iter.leaf)->rows + uVar2,
            (ulong)(iter.row + 1) * -4 + 0x38);
    (iter.leaf)->rows[uVar2].i = (int)pos + 1;
    local_60 = (undefined **)CONCAT71(local_60._1_7_,1);
    local_58.value.success = (bool *)&iter;
    local_58.value.pos = &pos_local;
    *this = (Impl<1UL,_false>)0x0;
    iter.tree._0_1_ = 1;
    local_58.value.indexObj = (HashIndex<kj::_::(anonymous_namespace)::StringHasher> *)(table + 1);
    local_58.value.table = table;
    local_58.value.row = row;
    _::
    Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.h:450:5)>
    ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_table_h:450:5)>
                 *)&local_60);
    aVar3 = extraout_RDX;
  }
LAB_00162995:
  MVar4.ptr.field_1.value = aVar3.value;
  MVar4.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar4.ptr;
}

Assistant:

static kj::Maybe<size_t> insert(Table<Row, Indexes...>& table, size_t pos, Row& row, uint skip) {
    if (skip == index) {
      return Impl<index + 1>::insert(table, pos, row, skip);
    }
    auto& indexObj = get<index>(table.indexes);
    KJ_IF_SOME(existing, indexObj.insert(table.rows.asPtr(), pos, indexObj.keyForRow(row))) {
      return existing;
    }

    bool success = false;
    KJ_DEFER(if (!success) {
      indexObj.erase(table.rows.asPtr(), pos, indexObj.keyForRow(row));
    });
    auto result = Impl<index + 1>::insert(table, pos, row, skip);
    success = result == kj::none;
    return result;
  }